

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
cbtBvhTriangleMeshShape::setLocalScaling(cbtBvhTriangleMeshShape *this,cbtVector3 *scaling)

{
  float fVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *pfVar3;
  
  iVar2 = (*(this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[7])();
  pfVar3 = (float *)CONCAT44(extraout_var,iVar2);
  fVar1 = pfVar3[1] - scaling->m_floats[1];
  auVar4 = ZEXT416((uint)(*pfVar3 - scaling->m_floats[0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar4,auVar4);
  auVar5 = ZEXT416((uint)(pfVar3[2] - scaling->m_floats[2]));
  auVar4 = vfmadd231ss_fma(auVar4,auVar5,auVar5);
  if (1.1920929e-07 < auVar4._0_4_) {
    cbtTriangleMeshShape::setLocalScaling(&this->super_cbtTriangleMeshShape,scaling);
    buildOptimizedBvh(this);
    return;
  }
  return;
}

Assistant:

void cbtBvhTriangleMeshShape::setLocalScaling(const cbtVector3& scaling)
{
	if ((getLocalScaling() - scaling).length2() > SIMD_EPSILON)
	{
		cbtTriangleMeshShape::setLocalScaling(scaling);
		buildOptimizedBvh();
	}
}